

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O1

void testMinMaxEigenValue<Imath_3_2::Matrix33<float>>(Matrix33<float> *A)

{
  uint i;
  long lVar1;
  float *pfVar2;
  float (*pafVar3) [3];
  uint j;
  long lVar4;
  float fVar5;
  float fVar6;
  TV maxV;
  TV minV;
  TV S;
  Vec3 local_e0 [12];
  Vec3 local_d4 [12];
  undefined8 local_c8;
  float afStack_c0 [10];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  float local_18;
  
  local_98 = 0x3f800000;
  uStack_90 = 0;
  local_88 = 0x3f800000;
  uStack_80 = 0;
  local_78 = 0x3f800000;
  local_c8 = 0x3f800000;
  afStack_c0[0] = 0.0;
  afStack_c0[1] = 0.0;
  afStack_c0[2] = 1.0;
  afStack_c0[3] = 0.0;
  afStack_c0[4] = 0.0;
  afStack_c0[5] = 0.0;
  afStack_c0[6] = 1.0;
  fVar5 = 0.0;
  lVar1 = 0;
  pafVar3 = (float (*) [3])A;
  do {
    lVar4 = 0;
    fVar6 = fVar5;
    do {
      fVar5 = ABS((*(float (*) [3])*pafVar3)[lVar4]);
      if (fVar5 <= fVar6) {
        fVar5 = fVar6;
      }
      lVar4 = lVar4 + 1;
      fVar6 = fVar5;
    } while (lVar4 != 3);
    lVar1 = lVar1 + 1;
    pafVar3 = pafVar3 + 1;
  } while (lVar1 != 3);
  fVar6 = 1.1920929e-07;
  if (1.1920929e-07 <= fVar5) {
    fVar6 = fVar5;
  }
  fVar5 = fVar6 * 100.0 * 1.1920929e-07;
  local_38 = *(undefined8 *)A->x[0];
  uStack_30 = *(undefined8 *)(A->x[0] + 2);
  local_28 = *(undefined8 *)(A->x[1] + 1);
  uStack_20 = *(undefined8 *)A->x[2];
  local_18 = A->x[2][2];
  Imath_3_2::minEigenVector<Imath_3_2::Matrix33<float>,Imath_3_2::Vec3<float>>
            ((Matrix33 *)&local_38,local_d4);
  local_68 = *(undefined8 *)A->x[0];
  uStack_60 = *(undefined8 *)(A->x[0] + 2);
  local_58 = *(undefined8 *)(A->x[1] + 1);
  uStack_50 = *(undefined8 *)A->x[2];
  local_48 = A->x[2][2];
  Imath_3_2::maxEigenVector<Imath_3_2::Matrix33<float>,Imath_3_2::Vec3<float>>
            ((Matrix33 *)&local_68,local_e0);
  local_38 = *(undefined8 *)A->x[0];
  uStack_30 = *(undefined8 *)(A->x[0] + 2);
  local_28 = *(undefined8 *)(A->x[1] + 1);
  uStack_20 = *(undefined8 *)A->x[2];
  local_18 = A->x[2][2];
  lVar1 = 0;
  Imath_3_2::jacobiSVD<float>
            ((Matrix33 *)&local_38,(Matrix33 *)&local_98,(Vec3 *)&local_68,(Matrix33 *)&local_c8,
             1.1920929e-07,false);
  pfVar2 = afStack_c0;
  while( true ) {
    if (fVar5 <= ABS(*(float *)(local_d4 + lVar1 * 4) - *pfVar2)) {
      __assert_fail("abs (minV[i] - V[i][dim - 1]) < threshold",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                    ,0x97,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix33<float>]")
      ;
    }
    if (fVar5 <= ABS(*(float *)(local_e0 + lVar1 * 4) - pfVar2[-2])) break;
    lVar1 = lVar1 + 1;
    pfVar2 = pfVar2 + 3;
    if (lVar1 == 3) {
      return;
    }
  }
  __assert_fail("abs (maxV[i] - V[i][0]) < threshold",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,0x98,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix33<float>]");
}

Assistant:

void
testMinMaxEigenValue (const TM& A)
{
    typedef typename TM::BaseVecType TV;
    typedef typename TM::BaseType    T;

    TV minV, maxV, S;
    TM U, V;

    const T threshold = computeThreshold (A);

    {
        TM A1 (A);
        minEigenVector (A1, minV);
        TM A2 (A);
        maxEigenVector (A2, maxV);
    }
    {
        TM A3 (A);
        jacobiSVD (A3, U, S, V);
    }

    const int dim = TM::dimensions ();

    for (int i = 0; i < dim; ++i)
    {
        assert (abs (minV[i] - V[i][dim - 1]) < threshold);
        assert (abs (maxV[i] - V[i][0]) < threshold);
    }
}